

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::ModuleLevelServiceDescriptorName_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,ServiceDescriptor *descriptor)

{
  DescriptorStringView psVar1;
  FileDescriptor *pFVar2;
  string_view filename;
  AlphaNum local_178;
  AlphaNum local_148;
  undefined1 local_118 [16];
  string local_108;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  undefined1 local_21;
  ServiceDescriptor *local_20;
  ServiceDescriptor *descriptor_local;
  Generator *this_local;
  string *name;
  
  local_21 = 0;
  local_20 = descriptor;
  descriptor_local = (ServiceDescriptor *)this;
  this_local = (Generator *)__return_storage_ptr__;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_58,"_");
  psVar1 = ServiceDescriptor::name_abi_cxx11_(local_20);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_88,psVar1);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_58);
  absl::lts_20240722::AsciiStrToUpper((string *)__return_storage_ptr__);
  pFVar2 = ServiceDescriptor::file(local_20);
  if (pFVar2 != this->file_) {
    pFVar2 = ServiceDescriptor::file(local_20);
    psVar1 = FileDescriptor::name_abi_cxx11_(pFVar2);
    local_118 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1);
    filename._M_len = local_118._8_8_;
    filename._M_str = (char *)this;
    (anonymous_namespace)::ModuleAlias_abi_cxx11_(&local_108,local_118._0_8_,filename);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_e8,&local_108);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_148,".");
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_178,__return_storage_ptr__);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_b8,&local_e8,&local_148);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelServiceDescriptorName(
    const ServiceDescriptor& descriptor) const {
  std::string name = absl::StrCat("_", descriptor.name());
  absl::AsciiStrToUpper(&name);
  if (descriptor.file() != file_) {
    name = absl::StrCat(ModuleAlias(descriptor.file()->name()), ".", name);
  }
  return name;
}